

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O3

void __thiscall bgui::FileImageWindow::saveContent(FileImageWindow *this,char *basename)

{
  long lVar1;
  int iVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar ***pppuVar5;
  ImageIO *this_00;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  string name;
  string base;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_108;
  FileImageWindow *local_d0;
  string local_c8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_a8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108.depth = 0;
  local_108.width = 0;
  local_108.height = 0;
  local_108.n = 0;
  local_108.pixel = (uchar *)0x0;
  local_108.row = (uchar **)0x0;
  local_108.img = (uchar ***)0x0;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&local_108,0,0,1);
  BaseWindow::getContent((BaseWindow *)this,&local_108);
  lVar12 = local_108.height;
  if (local_108.height < 1) {
    lVar7 = 0;
LAB_0011c30b:
    lVar6 = local_108.height + -1;
  }
  else {
    lVar6 = 0;
    do {
      if (0 < local_108.depth) {
        uVar11 = 0;
        bVar14 = false;
        lVar7 = local_108.width;
        do {
          while (lVar7 < 1) {
            uVar11 = uVar11 + 1;
            bVar14 = (uint)local_108.depth <= uVar11;
            lVar7 = local_108.width;
            if (uVar11 == (uint)local_108.depth) goto LAB_0011c28c;
          }
          lVar13 = lVar7 + -1;
          lVar7 = lVar7 + -1;
        } while (local_108.img[uVar11][lVar6][lVar13] == '\0');
        lVar7 = lVar6;
        if (!bVar14) break;
      }
LAB_0011c28c:
      lVar6 = lVar6 + 1;
      lVar7 = local_108.height;
    } while (lVar6 != local_108.height);
    if (local_108.height < 1) goto LAB_0011c30b;
    do {
      lVar6 = lVar12 + -1;
      if (0 < local_108.depth) {
        uVar11 = 0;
        bVar14 = false;
        lVar13 = local_108.width;
        do {
          while (lVar13 < 1) {
            uVar11 = uVar11 + 1;
            bVar14 = (uint)local_108.depth <= uVar11;
            lVar13 = local_108.width;
            if (uVar11 == (uint)local_108.depth) goto LAB_0011c2f1;
          }
          lVar9 = lVar13 + -1;
          lVar13 = lVar13 + -1;
        } while (local_108.img[uVar11][lVar6][lVar9] == '\0');
        if (!bVar14) goto LAB_0011c30e;
      }
LAB_0011c2f1:
      lVar12 = lVar6;
    } while (0 < lVar6);
    lVar6 = -1;
    lVar12 = 0;
  }
LAB_0011c30e:
  lVar13 = local_108.width;
  if (local_108.width < 1) {
    lVar9 = 0;
  }
  else {
    lVar8 = 0;
    do {
      if (0 < local_108.depth) {
        uVar11 = 0;
        bVar14 = false;
        lVar9 = local_108.height;
        do {
          while (lVar9 < 1) {
            uVar11 = uVar11 + 1;
            bVar14 = (uint)local_108.depth <= uVar11;
            lVar9 = local_108.height;
            if (uVar11 == (uint)local_108.depth) goto LAB_0011c35f;
          }
          lVar10 = lVar9 + -1;
          lVar9 = lVar9 + -1;
        } while (local_108.img[uVar11][lVar10][lVar8] == '\0');
        lVar9 = lVar8;
        if (!bVar14) break;
      }
LAB_0011c35f:
      lVar8 = lVar8 + 1;
      lVar9 = local_108.width;
    } while (lVar8 != local_108.width);
    if (0 < local_108.width) {
      do {
        lVar8 = lVar13 + -1;
        local_d0 = this;
        if (0 < local_108.depth) {
          uVar11 = 0;
          bVar14 = false;
          lVar10 = local_108.height;
          do {
            while (lVar10 < 1) {
              uVar11 = uVar11 + 1;
              bVar14 = (uint)local_108.depth <= uVar11;
              lVar10 = local_108.height;
              if (uVar11 == (uint)local_108.depth) goto LAB_0011c3c9;
            }
            lVar1 = lVar10 + -1;
            lVar10 = lVar10 + -1;
          } while (local_108.img[uVar11][lVar1][lVar8] == '\0');
          if (!bVar14) goto LAB_0011c3fd;
        }
LAB_0011c3c9:
        lVar13 = lVar8;
      } while (0 < lVar8);
      lVar8 = -1;
      lVar13 = 0;
      goto LAB_0011c3fd;
    }
  }
  lVar8 = local_108.width + -1;
LAB_0011c3fd:
  if ((lVar7 < lVar12) && (lVar9 < lVar13)) {
    lVar12 = (lVar8 - lVar9) + 1;
    if (((lVar9 != 0 || lVar7 != 0) || (lVar12 < local_108.width)) ||
       ((lVar6 - lVar7) + 1 < local_108.height)) {
      gimage::cropImage<unsigned_char>(&local_a8,&local_108,lVar9,lVar7,lVar12,(lVar6 - lVar7) + 1);
      pppuVar5 = local_108.img;
      ppuVar4 = local_108.row;
      puVar3 = local_108.pixel;
      lVar6 = local_108.n;
      lVar7 = local_108.height;
      lVar12 = local_108.width;
      iVar2 = local_108.depth;
      local_108.depth = local_a8.depth;
      local_a8.depth = iVar2;
      local_108.width = local_a8.width;
      local_108.height = local_a8.height;
      local_a8.width = lVar12;
      local_a8.height = lVar7;
      local_108.n = local_a8.n;
      local_a8.n = lVar6;
      local_108.pixel = local_a8.pixel;
      local_108.row = local_a8.row;
      local_a8.pixel = puVar3;
      local_a8.row = ppuVar4;
      local_108.img = local_a8.img;
      local_a8.img = pppuVar5;
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_a8);
    }
    std::__cxx11::string::string((string *)&local_a8,basename,(allocator *)&local_c8);
    lVar12 = std::__cxx11::string::rfind((char)&local_a8,0x2e);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,CONCAT44(local_a8._4_4_,local_a8.depth),
               local_a8.width + CONCAT44(local_a8._4_4_,local_a8.depth));
    gimage::getNewImageName(&local_c8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_c8._M_string_length == 0) {
      BaseWindow::setInfoLine
                ((BaseWindow *)this,"Sorry, cannot determine file name for storing image!",true,true
                );
    }
    else {
      this_00 = gimage::getImageIO();
      gimage::ImageIO::save(this_00,&local_108,local_c8._M_dataplus._M_p);
      std::operator+(&local_50,"Saved as ",&local_c8);
      BaseWindow::setInfoLine((BaseWindow *)this,local_50._M_dataplus._M_p,true,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((long *)CONCAT44(local_a8._4_4_,local_a8.depth) != &local_a8.height) {
      operator_delete((undefined1 *)CONCAT44(local_a8._4_4_,local_a8.depth));
    }
  }
  else {
    BaseWindow::setInfoLine((BaseWindow *)this,"Empty image!",true,true);
  }
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_108);
  return;
}

Assistant:

void FileImageWindow::saveContent(const char *basename)
{
  gimage::ImageU8 image;

  getContent(image);

  // strip black borders from image

  long k0=0;

  while (k0 < image.getHeight() && isImageRowEmpty(image, k0))
  {
    k0++;
  }

  long k1=image.getHeight()-1;

  while (k1 >= 0 && isImageRowEmpty(image, k1))
  {
    k1--;
  }

  long i0=0;

  while (i0 < image.getWidth() && isImageColumnEmpty(image, i0))
  {
    i0++;
  }

  long i1=image.getWidth()-1;

  while (i1 >= 0 && isImageColumnEmpty(image, i1))
  {
    i1--;
  }

  if (i0 <= i1 && k0 <= k1)
  {
    if (i0 > 0 || k0 > 0 || i1-i0+1 < image.getWidth() ||
        k1-k0+1 < image.getHeight())
    {
      image=cropImage(image, i0, k0, i1-i0+1, k1-k0+1);
    }

    // find file name that is not used

    std::string base=basename;

    size_t i=base.rfind('.');

    if (i != base.npos)
    {
      base=base.substr(0, i);
    }

    std::string name=gimage::getNewImageName(base);

    if (name.size() > 0)
    {
      gimage::getImageIO().save(image, name.c_str());
      setInfoLine(("Saved as "+name).c_str());
    }
    else
    {
      setInfoLine("Sorry, cannot determine file name for storing image!");
    }
  }
  else
  {
    setInfoLine("Empty image!");
  }
}